

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_comp.cpp
# Opt level: O0

void __thiscall basisu::basis_compressor::basis_compressor(basis_compressor *this)

{
  long in_RDI;
  basisu_frontend *this_00;
  basisu_backend *this_01;
  basisu_backend_output *this_02;
  basisu_file *in_stack_ffffffffffffff60;
  basis_compressor_params *in_stack_ffffffffffffff90;
  
  basis_compressor_params::basis_compressor_params(in_stack_ffffffffffffff90);
  *(undefined8 *)(in_RDI + 0x248) = 0;
  this_00 = (basisu_frontend *)(in_RDI + 0x250);
  vector<basisu::image>::vector((vector<basisu::image> *)this_00);
  vector<basisu::image_stats>::vector((vector<basisu::image_stats> *)(in_RDI + 0x260));
  *(undefined4 *)(in_RDI + 0x270) = 0;
  *(undefined8 *)(in_RDI + 0x278) = 0;
  this_01 = (basisu_backend *)(in_RDI + 0x280);
  vector<basisu::basisu_backend_slice_desc>::vector
            ((vector<basisu::basisu_backend_slice_desc> *)this_01);
  *(undefined4 *)(in_RDI + 0x290) = 0;
  basisu_frontend::basisu_frontend(this_00);
  vector<basisu::pixel_block>::vector((vector<basisu::pixel_block> *)(in_RDI + 0x458));
  vector<basisu::gpu_image>::vector((vector<basisu::gpu_image> *)(in_RDI + 0x468));
  vector<basisu::gpu_image>::vector((vector<basisu::gpu_image> *)(in_RDI + 0x478));
  vector<basisu::image>::vector((vector<basisu::image> *)(in_RDI + 0x488));
  this_02 = (basisu_backend_output *)(in_RDI + 0x498);
  basisu_backend::basisu_backend(this_01);
  basisu_file::basisu_file(in_stack_ffffffffffffff60);
  vector<basisu::gpu_image>::vector((vector<basisu::gpu_image> *)(in_RDI + 0x668));
  vector<basisu::image>::vector((vector<basisu::image> *)(in_RDI + 0x678));
  vector<basisu::gpu_image>::vector((vector<basisu::gpu_image> *)(in_RDI + 0x688));
  vector<basisu::image>::vector((vector<basisu::image> *)(in_RDI + 0x698));
  vector<unsigned_char>::vector((vector<unsigned_char> *)(in_RDI + 0x6a8));
  vector<unsigned_char>::vector((vector<unsigned_char> *)(in_RDI + 0x6b8));
  vector<basisu::gpu_image>::vector((vector<basisu::gpu_image> *)(in_RDI + 0x6c8));
  basisu_backend_output::basisu_backend_output(this_02);
  *(undefined1 *)(in_RDI + 0x748) = 0;
  *(undefined1 *)(in_RDI + 0x749) = 0;
  debug_printf("basis_compressor::basis_compressor\n");
  if ((g_library_initialized & 1) != 0) {
    return;
  }
  __assert_fail("g_library_initialized",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_comp.cpp"
                ,0x3b,"basisu::basis_compressor::basis_compressor()");
}

Assistant:

basis_compressor::basis_compressor() :
	   m_pOpenCL_context(nullptr),
		m_basis_file_size(0),
		m_basis_bits_per_texel(0.0f),
		m_total_blocks(0),
		m_any_source_image_has_alpha(false),
	   m_opencl_failed(false)
	{
		debug_printf("basis_compressor::basis_compressor\n");
		
		assert(g_library_initialized);
	}